

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
create_stats_buffer(FIRSTPASS_STATS **frame_stats_buffer,STATS_BUFFER_CTX *stats_buf_context,
                   int num_lap_buffers)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  int size;
  aom_codec_err_t res;
  aom_codec_err_t local_4;
  
  local_4 = AOM_CODEC_OK;
  iVar1 = get_stats_buf_size(in_EDX,0x30);
  pvVar2 = aom_calloc((size_t)in_RSI,CONCAT44(in_EDX,local_4));
  *in_RDI = (long)pvVar2;
  if (*in_RDI == 0) {
    local_4 = AOM_CODEC_MEM_ERROR;
  }
  else {
    *in_RSI = *in_RDI;
    in_RSI[1] = *in_RSI;
    in_RSI[2] = *in_RSI + (long)iVar1 * 0xe8;
    pvVar2 = aom_calloc((size_t)in_RSI,CONCAT44(in_EDX,local_4));
    in_RSI[4] = (long)pvVar2;
    if (in_RSI[4] == 0) {
      local_4 = AOM_CODEC_MEM_ERROR;
    }
    else {
      av1_twopass_zero_stats((FIRSTPASS_STATS *)in_RSI[4]);
      pvVar2 = aom_calloc((size_t)in_RSI,CONCAT44(in_EDX,local_4));
      in_RSI[3] = (long)pvVar2;
      if (in_RSI[3] == 0) {
        local_4 = AOM_CODEC_MEM_ERROR;
      }
      else {
        av1_twopass_zero_stats((FIRSTPASS_STATS *)in_RSI[3]);
      }
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t create_stats_buffer(FIRSTPASS_STATS **frame_stats_buffer,
                                           STATS_BUFFER_CTX *stats_buf_context,
                                           int num_lap_buffers) {
  aom_codec_err_t res = AOM_CODEC_OK;

  int size = get_stats_buf_size(num_lap_buffers, MAX_LAG_BUFFERS);
  *frame_stats_buffer =
      (FIRSTPASS_STATS *)aom_calloc(size, sizeof(FIRSTPASS_STATS));
  if (*frame_stats_buffer == NULL) return AOM_CODEC_MEM_ERROR;

  stats_buf_context->stats_in_start = *frame_stats_buffer;
  stats_buf_context->stats_in_end = stats_buf_context->stats_in_start;
  stats_buf_context->stats_in_buf_end =
      stats_buf_context->stats_in_start + size;

  stats_buf_context->total_left_stats = aom_calloc(1, sizeof(FIRSTPASS_STATS));
  if (stats_buf_context->total_left_stats == NULL) return AOM_CODEC_MEM_ERROR;
  av1_twopass_zero_stats(stats_buf_context->total_left_stats);
  stats_buf_context->total_stats = aom_calloc(1, sizeof(FIRSTPASS_STATS));
  if (stats_buf_context->total_stats == NULL) return AOM_CODEC_MEM_ERROR;
  av1_twopass_zero_stats(stats_buf_context->total_stats);
  return res;
}